

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O2

void __thiscall duckdb::ErrorData::Throw(ErrorData *this,string *prepended_message)

{
  Exception *pEVar1;
  string new_message;
  
  if (prepended_message->_M_string_length == 0) {
    pEVar1 = (Exception *)__cxa_allocate_exception(0x10);
    Exception::Exception(pEVar1,this->type,&this->raw_message,&this->extra_info);
    __cxa_throw(pEVar1,&Exception::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::operator+(&new_message,prepended_message,&this->raw_message);
  pEVar1 = (Exception *)__cxa_allocate_exception(0x10);
  Exception::Exception(pEVar1,this->type,&new_message,&this->extra_info);
  __cxa_throw(pEVar1,&Exception::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ErrorData::Throw(const string &prepended_message) const {
	D_ASSERT(initialized);
	if (!prepended_message.empty()) {
		string new_message = prepended_message + raw_message;
		throw Exception(type, new_message, extra_info);
	} else {
		throw Exception(type, raw_message, extra_info);
	}
}